

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_gost2015.c
# Opt level: O2

int gost2015_final_call(EVP_CIPHER_CTX *ctx,EVP_MD_CTX *omac_ctx,size_t mac_size,
                       uchar *encrypted_mac,
                       _func_int_EVP_CIPHER_CTX_ptr_uchar_ptr_uchar_ptr_size_t *do_cipher)

{
  int iVar1;
  size_t mac_size_local;
  uchar calculated_mac [16];
  uchar expected_mac [16];
  
  calculated_mac[0] = '\0';
  calculated_mac[1] = '\0';
  calculated_mac[2] = '\0';
  calculated_mac[3] = '\0';
  calculated_mac[4] = '\0';
  calculated_mac[5] = '\0';
  calculated_mac[6] = '\0';
  calculated_mac[7] = '\0';
  calculated_mac[8] = '\0';
  calculated_mac[9] = '\0';
  calculated_mac[10] = '\0';
  calculated_mac[0xb] = '\0';
  calculated_mac[0xc] = '\0';
  calculated_mac[0xd] = '\0';
  calculated_mac[0xe] = '\0';
  calculated_mac[0xf] = '\0';
  mac_size_local = mac_size;
  iVar1 = EVP_CIPHER_CTX_is_encrypting();
  if (iVar1 == 0) {
    expected_mac[0] = '\0';
    expected_mac[1] = '\0';
    expected_mac[2] = '\0';
    expected_mac[3] = '\0';
    expected_mac[4] = '\0';
    expected_mac[5] = '\0';
    expected_mac[6] = '\0';
    expected_mac[7] = '\0';
    expected_mac[8] = '\0';
    expected_mac[9] = '\0';
    expected_mac[10] = '\0';
    expected_mac[0xb] = '\0';
    expected_mac[0xc] = '\0';
    expected_mac[0xd] = '\0';
    expected_mac[0xe] = '\0';
    expected_mac[0xf] = '\0';
    EVP_DigestSignFinal((EVP_MD_CTX *)omac_ctx,calculated_mac,&mac_size_local);
    iVar1 = (*do_cipher)(ctx,expected_mac,encrypted_mac,mac_size_local);
    if ((0 < iVar1) &&
       (iVar1 = CRYPTO_memcmp(expected_mac,calculated_mac,mac_size_local), iVar1 == 0)) {
      return 0;
    }
  }
  else {
    EVP_DigestSignFinal((EVP_MD_CTX *)omac_ctx,calculated_mac,&mac_size_local);
    iVar1 = (*do_cipher)(ctx,encrypted_mac,calculated_mac,mac_size_local);
    if (0 < iVar1) {
      return 0;
    }
  }
  return -1;
}

Assistant:

int gost2015_final_call(EVP_CIPHER_CTX *ctx, EVP_MD_CTX *omac_ctx, size_t mac_size,
    unsigned char *encrypted_mac,
    int (*do_cipher) (EVP_CIPHER_CTX *ctx,
    unsigned char *out,
    const unsigned char *in,
    size_t inl))
{
    unsigned char calculated_mac[KUZNYECHIK_MAC_MAX_SIZE];
    memset(calculated_mac, 0, KUZNYECHIK_MAC_MAX_SIZE);

    if (EVP_CIPHER_CTX_encrypting(ctx)) {
        EVP_DigestSignFinal(omac_ctx, calculated_mac, &mac_size);

        if (do_cipher(ctx, encrypted_mac, calculated_mac, mac_size) <= 0) {
            return -1;
        }
    } else {
        unsigned char expected_mac[KUZNYECHIK_MAC_MAX_SIZE];

        memset(expected_mac, 0, KUZNYECHIK_MAC_MAX_SIZE);
        EVP_DigestSignFinal(omac_ctx, calculated_mac, &mac_size);

        if (do_cipher(ctx, expected_mac, encrypted_mac, mac_size) <= 0) {
            return -1;
        }

        if (CRYPTO_memcmp(expected_mac, calculated_mac, mac_size) != 0)
            return -1;
    }
    return 0;
}